

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program::
description_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  void *local_18;
  Program *this_local;
  
  local_18 = this;
  this_local = (Program *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_b8);
  std::operator+(&local_98,&local_b8,"winding mode ");
  pcVar1 = anon_unknown_1::getWindingShaderName(*this);
  std::operator+(&local_78,&local_98,pcVar1);
  std::operator+(&local_58,&local_78,", ");
  pcVar1 = "don\'t ";
  if ((*(byte *)((long)this + 4) & 1) != 0) {
    pcVar1 = "";
  }
  std::operator+(&local_38,&local_58,pcVar1);
  std::operator+(__return_storage_ptr__,&local_38,"use point mode");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

string	description		(void) const { return string() + "winding mode " + getWindingShaderName(winding) + ", " + (usePointMode ? "" : "don't ") + "use point mode"; }